

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bss_section.cpp
# Opt level: O1

void __thiscall BssSectionImport_MissingSize_Test::TestBody(BssSectionImport_MissingSize_Test *this)

{
  char *message;
  not_null<pstore::repo::section_content_*> expected_predicate_value;
  pointer *__ptr;
  error_code eVar1;
  AssertionResult gtest_ar_;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  inserter;
  AssertionResult gtest_ar;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  dispatchers;
  section_content imported_content;
  not_null<pstore::repo::section_content_*> in_stack_fffffffffffffd78;
  AssertHelper local_280;
  undefined1 local_278 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  long local_268 [2];
  AssertHelper local_258;
  undefined1 local_250 [8];
  undefined1 local_248 [8];
  __uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  _Stack_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  __uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  local_228;
  __uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_> _Stack_220
  ;
  _List_node_base local_218;
  pointer local_208;
  element_type *peStack_200;
  __node_base local_1f8;
  __node_base _Stack_1f0;
  uint64_t local_1e8;
  size_t sStack_1e0;
  __node_base_ptr local_1d8;
  mutex_type *pmStack_1d0;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  local_1c8;
  not_null<pstore::repo::section_content_*> local_1a8;
  parser<pstore::exchange::import_ns::callbacks> local_1a0;
  section_content local_f8;
  
  local_250 = (undefined1  [8])&local_1c8;
  local_1c8.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.kind = text;
  local_f8.align = '\x01';
  memset(&local_f8.data,0,0xa0);
  local_f8.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278 = (undefined1  [8])local_268;
  local_f8.data.buffer_ = local_f8.data.small_buffer_._M_elems;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"{ \"align\":8 }","");
  local_238._8_8_ = (long)local_238._M_local_buf + 8;
  local_238._M_allocated_capacity = 0;
  local_1d8 = (__node_base_ptr)0x0;
  pmStack_1d0 = (mutex_type *)0x0;
  local_248 = (undefined1  [8])0x0;
  _Stack_240._M_t.
  super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
       (tuple<std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        )(_Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
          )0x0;
  local_218._M_next = &local_218;
  _Stack_220._M_t.
  super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>.
  super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl =
       (tuple<pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>)
       (_Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>)
       0x0;
  local_208 = (pointer)0x0;
  peStack_200 = (element_type *)&pmStack_1d0;
  local_1f8._M_nxt = (_Hash_node_base *)0x1;
  _Stack_1f0._M_nxt = (_Hash_node_base *)0x0;
  local_1e8 = 0;
  sStack_1e0 = 0x3f800000;
  local_1a8.ptr_ = &local_f8;
  local_228._M_t.
  super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
  .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl =
       (tuple<pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
        )(tuple<pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
          )local_238._8_8_;
  local_218._M_prev = local_218._M_next;
  pstore::gsl::not_null<pstore::repo::section_content_*>::ensure_invariant(&local_1a8);
  expected_predicate_value.ptr_ = local_1a8.ptr_;
  (anonymous_namespace)::
  parse<(pstore::repo::section_kind)2,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>
            (&local_1a0,(_anonymous_namespace_ *)local_278,
             (string *)&(this->super_BssSectionImport).db_,(database *)local_248,
             (string_mapping *)local_250,
             (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
              *)local_1a8.ptr_,in_stack_fffffffffffffd78);
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)local_248);
  if (local_278 != (undefined1  [8])local_268) {
    operator_delete((void *)local_278,local_268[0] + 1);
  }
  local_278[0] = local_1a0.error_._M_value != 0;
  local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1a0.error_._M_value == 0) {
    testing::Message::Message((Message *)&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_248,(internal *)local_278,(AssertionResult *)0x1df922,"false","true",
               (char *)expected_predicate_value.ptr_);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
               ,0x10e,(char *)local_248);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if (local_248 != (undefined1  [8])&local_238) {
      operator_delete((void *)local_248,(ulong)(local_238._M_allocated_capacity + 1));
    }
    if (local_280.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_280.data_ + 8))();
    }
  }
  if (local_270 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_270,local_270);
  }
  eVar1 = pstore::exchange::import_ns::make_error_code(bss_section_was_incomplete);
  local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)eVar1._M_cat;
  local_278._0_4_ = eVar1._M_value;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)local_248,"parser.last_error ()",
             "make_error_code (pstore::exchange::import_ns::error::bss_section_was_incomplete)",
             &local_1a0.error_,(error_code *)local_278);
  if (local_248[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_278);
    if ((__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         )_Stack_240._M_t.
          super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
          .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)_Stack_240._M_t.
                          super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
                          .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>.
                          _M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
               ,0x110,message);
    testing::internal::AssertHelper::operator=(&local_280,(Message *)local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    if (local_278 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_278 + 8))();
    }
  }
  if (_Stack_240._M_t.
      super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
      .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       )0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_240._M_t.
                 super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
                 .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>.
                 _M_head_impl);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.string_._M_dataplus._M_p != &local_1a0.string_.field_2) {
    operator_delete(local_1a0.string_._M_dataplus._M_p,
                    local_1a0.string_.field_2._M_allocated_capacity + 1);
  }
  if (local_1a0.callbacks_.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a0.callbacks_.context_.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque(&local_1a0.stack_.c);
  if ((_Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
       )local_1a0.singletons_._M_t.
        super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
        .
        super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
        ._M_head_impl !=
      (_Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
       )0x0) {
    operator_delete((void *)local_1a0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  if (local_f8.xfixups.
      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.xfixups.
                    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.xfixups.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.xfixups.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.ifixups.
      super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.ifixups.
                    super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.ifixups.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.ifixups.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.data.big_buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.data.big_buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.data.big_buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.data.big_buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::~vector(&local_1c8);
  return;
}

Assistant:

TEST_F (BssSectionImport, MissingSize) {
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);
    pstore::repo::section_content imported_content;

    // The data value is missing.
    auto const & parser = parse<pstore::repo::section_kind::bss> (
        R"({ "align":8 })", &db_, pstore::exchange::import_ns::string_mapping{}, &inserter,
        &imported_content);
    EXPECT_TRUE (parser.has_error ());
    EXPECT_EQ (parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::bss_section_was_incomplete));
}